

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O2

sexp_conflict sexp_get_environment_variables(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  char *__s;
  char *pcVar1;
  undefined8 *puVar2;
  sexp_conflict psVar3;
  sexp_conflict val;
  sexp_conflict name;
  sexp_conflict local_68;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &val;
  local_40.var = &name;
  name = (sexp_conflict)0x43e;
  val = (sexp_conflict)0x43e;
  local_60.var = &local_68;
  local_40.next = &local_60;
  local_60.next = (ctx->value).context.saves;
  local_50.next = &local_40;
  (ctx->value).context.saves = &local_50;
  local_68 = (sexp_conflict)0x23e;
  psVar3 = (sexp_conflict)0x23e;
  for (puVar2 = _environ; __s = (char *)*puVar2, __s != (char *)0x0; puVar2 = puVar2 + 1) {
    pcVar1 = strchr(__s,0x3d);
    if (pcVar1 != (char *)0x0) {
      name = (sexp_conflict)sexp_c_string(ctx,__s,(long)pcVar1 - (long)__s);
      val = (sexp_conflict)sexp_c_string(ctx,pcVar1 + 1,0xffffffffffffffff);
      val = (sexp_conflict)sexp_cons_op(ctx,0,2,name,val);
      psVar3 = (sexp_conflict)sexp_cons_op(ctx,0,2,val,local_68);
      local_68 = psVar3;
    }
  }
  (ctx->value).context.saves = local_60.next;
  return psVar3;
}

Assistant:

sexp sexp_get_environment_variables (sexp ctx, sexp self, sexp_sint_t n) {
  int i;
  char **env, *cname, *cval;
  sexp_gc_var3(res, name, val);
  sexp_gc_preserve3(ctx, res, name, val);
  res = SEXP_NULL;
#ifndef PLAN9
  env = environ;
  for (i=0; env[i]; i++) {
    cname = env[i];
    cval = strchr(cname, '=');
    if (cval) {
      name = sexp_c_string(ctx, cname, cval-cname);
      val = sexp_c_string(ctx, cval+1, -1);
      val = sexp_cons(ctx, name, val);
      res = sexp_cons(ctx, val, res);
    }
  }
#endif
  sexp_gc_release3(ctx);
  return res;
}